

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_int16_suite::fail_array32_int16_missing_two(void)

{
  value_type input [7];
  decoder decoder;
  undefined4 local_40;
  value local_3c;
  uchar local_38 [8];
  decoder local_30;
  
  local_38[4] = '\0';
  local_38[5] = '\x12';
  local_38[6] = '4';
  local_38[0] = 0xca;
  local_38[1] = '\x04';
  local_38[2] = '\0';
  local_38[3] = '\0';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[7]>
            (&local_30,(uchar (*) [7])local_38);
  local_3c = local_30.current.code;
  local_40 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x789,"void compact_int16_suite::fail_array32_int16_missing_two()",&local_3c,&local_40
            );
  return;
}

Assistant:

void fail_array32_int16_missing_two()
{
    const value_type input[] = { token::code::array32_int16, 0x04, 0x00, 0x00, 0x00, 0x12, 0x34 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}